

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void BrotliStoreMetaBlockHeader(size_t len,int is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  long local_130;
  size_t nibbles;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  int is_uncompressed_local;
  size_t len_local;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  
  local_130 = 6;
  *(ulong *)(storage + (*storage_ix >> 3)) =
       0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 1;
  if (len < 0x10001) {
    local_130 = 4;
  }
  else if (len < 0x100001) {
    local_130 = 5;
  }
  *(ulong *)(storage + (*storage_ix >> 3)) =
       local_130 + -4 << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 2;
  *(size_t *)(storage + (*storage_ix >> 3)) =
       len - 1 << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = local_130 * 4 + *storage_ix;
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (long)is_uncompressed << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 1;
  return;
}

Assistant:

static void BrotliStoreMetaBlockHeader(
    size_t len, BROTLI_BOOL is_uncompressed, size_t* storage_ix,
    uint8_t* storage) {
  size_t nibbles = 6;
  /* ISLAST */
  BrotliWriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    nibbles = 4;
  } else if (len <= (1U << 20)) {
    nibbles = 5;
  }
  BrotliWriteBits(2, nibbles - 4, storage_ix, storage);
  BrotliWriteBits(nibbles * 4, len - 1, storage_ix, storage);
  /* ISUNCOMPRESSED */
  BrotliWriteBits(1, (uint64_t)is_uncompressed, storage_ix, storage);
}